

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::QueueCommand<swrenderer::DrawSpanMaskedAddClampPalCommand>(void)

{
  DrawSpanMaskedAddClampPalCommand *this;
  bool bVar1;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  value_type local_a8;
  DrawSpanMaskedAddClampPalCommand *local_a0;
  DrawSpanMaskedAddClampPalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_7a;
  _lambda_void___1_ local_79;
  undefined1 auStack_78 [8];
  DrawSpanMaskedAddClampPalCommand command;
  DrawerCommandQueue *queue;
  
  command.super_PalSpanCommand._96_8_ = Instance();
  if ((((DrawerCommandQueue *)command.super_PalSpanCommand._96_8_)->threaded_render == 0) ||
     (bVar1 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar1)) {
    command.super_PalSpanCommand._xbits = 0;
    command.super_PalSpanCommand._ybits = 0;
    command.super_PalSpanCommand._srcblend = (uint32_t *)0x0;
    command.super_PalSpanCommand._destorg = (uint8_t *)0x0;
    command.super_PalSpanCommand._xstep = 0;
    command.super_PalSpanCommand._ystep = 0;
    command.super_PalSpanCommand._y = 0;
    command.super_PalSpanCommand._x1 = 0;
    command.super_PalSpanCommand._x2 = 0;
    command.super_PalSpanCommand._52_4_ = 0;
    command.super_PalSpanCommand._colormap = (uint8_t *)0x0;
    command.super_PalSpanCommand._xfrac = 0;
    command.super_PalSpanCommand._yfrac = 0;
    command.super_PalSpanCommand.super_DrawerCommand._dest_y = 0;
    command.super_PalSpanCommand.super_DrawerCommand._12_4_ = 0;
    command.super_PalSpanCommand._source = (uint8_t *)0x0;
    auStack_78 = (undefined1  [8])0x0;
    command.super_PalSpanCommand.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    command.super_PalSpanCommand._destblend = (uint32_t *)0x0;
    swrenderer::DrawSpanMaskedAddClampPalCommand::DrawSpanMaskedAddClampPalCommand
              ((DrawSpanMaskedAddClampPalCommand *)auStack_78);
    tryBlock = QueueCommand()::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_79);
    catchBlock = QueueCommand()::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_7a);
    VectoredTryCatch((DrawSpanMaskedAddClampPalCommand *)auStack_78,tryBlock,catchBlock);
    swrenderer::DrawSpanMaskedAddClampPalCommand::~DrawSpanMaskedAddClampPalCommand
              ((DrawSpanMaskedAddClampPalCommand *)auStack_78);
  }
  else {
    command_1 = (DrawSpanMaskedAddClampPalCommand *)AllocMemory(0x68);
    if (command_1 == (DrawSpanMaskedAddClampPalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command.super_PalSpanCommand._96_8_);
      command_1 = (DrawSpanMaskedAddClampPalCommand *)AllocMemory(0x68);
      if (command_1 == (DrawSpanMaskedAddClampPalCommand *)0x0) {
        return;
      }
    }
    this = command_1;
    memset(command_1,0,0x68);
    swrenderer::DrawSpanMaskedAddClampPalCommand::DrawSpanMaskedAddClampPalCommand(this);
    local_a0 = this;
    local_a8 = (value_type)this;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool + command.super_PalSpanCommand._96_8_ + 0x599518),
               &local_a8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}